

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

IndexVector * __thiscall
Centaurus::NFABaseState<char,_int>::epsilon_transitions
          (IndexVector *__return_storage_ptr__,NFABaseState<char,_int> *this,bool *long_flag)

{
  bool bVar1;
  int local_58 [4];
  NFATransition<char> *local_48;
  NFATransition<char> *i;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *__range2
  ;
  bool *long_flag_local;
  NFABaseState<char,_int> *this_local;
  IndexVector *ret;
  
  IndexVector::IndexVector(__return_storage_ptr__);
  __end0 = std::
           vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
           ::begin(&this->m_transitions);
  i = (NFATransition<char> *)
      std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
      ::end(&this->m_transitions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
                                     *)&i), bVar1) {
    local_48 = __gnu_cxx::
               __normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
               ::operator*(&__end0);
    bVar1 = NFATransition<char>::is_epsilon(local_48);
    if (bVar1) {
      local_58[0] = NFATransition<char>::dest(local_48);
      std::vector<int,_std::allocator<int>_>::push_back
                (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,local_58);
    }
    bVar1 = NFATransition<char>::is_long(local_48);
    if (bVar1) {
      *long_flag = true;
    }
    __gnu_cxx::
    __normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

IndexVector epsilon_transitions(bool& long_flag) const
    {
        IndexVector ret;

        for (const auto& i : m_transitions)
        {
            if (i.is_epsilon())
            {
                ret.push_back(i.dest());
            }
            if (i.is_long())
            {
                long_flag = true;
            }
        }

        return ret;
    }